

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

MIR_reg_t get_stack_loc(gen_ctx_t gen_ctx,MIR_reg_t start_loc,MIR_type_t type,bitmap_t conflict_locs
                       ,int *slots_num_ref)

{
  void **ppvVar1;
  bb_t *ppbVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [32];
  byte bVar5;
  long *plVar6;
  bb_insn_t pbVar7;
  in_edge_t_conflict peVar8;
  in_edge_t peVar9;
  bitmap_t pVVar10;
  MIR_reg_t *pMVar11;
  HTAB_MIR_item_t *pHVar12;
  bb_t pbVar13;
  MIR_module_t pMVar14;
  VARR_MIR_reg_t *pVVar15;
  bb_t pbVar16;
  ra_ctx *prVar17;
  FILE *pFVar18;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  MIR_op_mode_t MVar27;
  MIR_type_t MVar28;
  MIR_reg_t MVar29;
  ulong extraout_RAX;
  in_edge_t peVar30;
  ulong uVar31;
  MIR_insn_t_conflict pMVar32;
  int64_t iVar33;
  MIR_insn_t_conflict insn;
  undefined1 (*pauVar34) [32];
  gen_ctx *pgVar35;
  ulong uVar36;
  MIR_disp_t disp;
  MIR_reg_t base_reg;
  gen_ctx_t pgVar37;
  long extraout_RDX;
  in_edge_t extraout_RDX_00;
  DLIST_in_edge_t *pDVar38;
  uint uVar39;
  gen_ctx *pgVar40;
  long lVar41;
  uint uVar42;
  undefined8 unaff_RBP;
  gen_ctx *pgVar43;
  uint uVar44;
  undefined4 in_register_00000034;
  gen_ctx_t pgVar45;
  gen_ctx_t pgVar46;
  ulong uVar47;
  gen_ctx *pgVar48;
  gen_ctx *bb;
  uint uVar49;
  gen_ctx_t pgVar50;
  gen_ctx *res;
  ulong uVar51;
  size_t sVar52;
  gen_ctx *unaff_R12;
  gen_ctx *pgVar53;
  DLIST_LINK_bb_t *pDVar54;
  MIR_context_t unaff_R13;
  MIR_context_t pMVar55;
  uint *puVar56;
  ulong uVar57;
  gen_ctx *unaff_R14;
  in_edge_t_conflict peVar58;
  MIR_context_t ctx;
  gen_ctx *unaff_R15;
  gen_ctx *bm;
  bool bVar59;
  lr_gap_t el;
  uint uStack_344;
  ulong uStack_328;
  int iStack_31c;
  gen_ctx *pgStack_318;
  DLIST_LINK_bb_t *pDStack_310;
  uint uStack_304;
  MIR_context_t pMStack_300;
  ulong uStack_2f8;
  size_t sStack_2f0;
  MIR_op_t MStack_2e8;
  uint *puStack_2b0;
  MIR_op_t MStack_2a8;
  MIR_op_t MStack_278;
  bb_t pbStack_248;
  bb_t pbStack_240;
  in_edge_t_conflict peStack_238;
  in_edge_t_conflict peStack_230;
  out_edge_t peStack_228;
  out_edge_t peStack_220;
  bb_insn_t pbStack_218;
  bb_insn_t pbStack_210;
  bitmap_t pVStack_208;
  bitmap_t pVStack_200;
  bitmap_t pVStack_1f8;
  bitmap_t pVStack_1f0;
  int aiStack_1e8 [12];
  undefined1 auStack_1b8 [16];
  undefined1 auStack_1a8 [16];
  undefined1 auStack_198 [16];
  gen_ctx *pgStack_150;
  gen_ctx *pgStack_148;
  MIR_context_t pMStack_140;
  in_edge_t_conflict peStack_138;
  gen_ctx *pgStack_130;
  gen_ctx *pgStack_128;
  gen_ctx_t pgStack_120;
  gen_ctx *pgStack_118;
  gen_ctx_t pgStack_110;
  in_edge_t peStack_108;
  MIR_context_t pMStack_100;
  uint uStack_f8;
  uint uStack_f4;
  gen_ctx *pgStack_f0;
  gen_ctx *pgStack_e8;
  ulong uStack_e0;
  gen_ctx *pgStack_d8;
  gen_ctx *pgStack_d0;
  MIR_context_t pMStack_c8;
  gen_ctx_t pgStack_c0;
  gen_ctx *pgStack_b8;
  gen_ctx *pgStack_b0;
  ulong uStack_a8;
  gen_ctx *pgStack_a0;
  gen_ctx *pgStack_98;
  MIR_context_t pMStack_90;
  gen_ctx_t pgStack_88;
  gen_ctx *pgStack_80;
  gen_ctx *pgStack_78;
  ulong uStack_70;
  gen_ctx *pgStack_68;
  gen_ctx *pgStack_60;
  gen_ctx *pgStack_58;
  code *pcStack_50;
  gen_ctx_t local_40;
  int *local_38;
  
  pgVar45 = (gen_ctx_t)CONCAT44(in_register_00000034,start_loc);
  sVar52 = gen_ctx->func_stack_slots_num;
  pgVar46 = (gen_ctx_t)(sVar52 + 0x21);
  pgVar37 = (gen_ctx_t)(ulong)start_loc;
  if (pgVar46 < pgVar37) {
    uVar39 = 1;
    uVar42 = 0xffffffff;
  }
  else {
    pgVar50 = (gen_ctx_t)(ulong)start_loc;
    uVar42 = 0xffffffff;
    do {
      uVar49 = (uint)pgVar50;
      bVar59 = 0x21 < uVar49 && type == MIR_T_LD;
      uVar44 = (uint)bVar59;
      uVar39 = uVar44 + 1;
      pgVar37 = (gen_ctx_t)(ulong)(uVar49 + bVar59);
      if (pgVar46 < pgVar37) break;
      if (conflict_locs == (bitmap_t)0x0) {
        pcStack_50 = available_hreg_p;
        local_40 = gen_ctx;
        local_38 = slots_num_ref;
        get_stack_loc_cold_1();
        iVar26 = (int)conflict_locs->size;
        iVar25 = *(int *)((long)&conflict_locs->size + 4);
        pgVar35 = (gen_ctx *)(long)iVar25;
        bVar59 = iVar25 < iVar26;
        if (iVar25 < iVar26) goto LAB_00170371;
        pgVar48 = (gen_ctx *)(long)(int)pgVar46;
        uVar44 = (int)pgVar46 + 1;
        pgVar40 = (gen_ctx *)(1L << ((ulong)uVar44 & 0x3f));
        uVar42 = (iVar25 - iVar26) + 1;
        res = (gen_ctx *)(long)iVar26;
        pgVar53 = unaff_R12;
        bm = unaff_R15;
        goto LAB_0017032b;
      }
      pgVar37 = (gen_ctx_t)(conflict_locs->els_num << 6);
      unaff_R14 = (gen_ctx *)(ulong)uVar39;
      unaff_R15 = (gen_ctx *)-(long)unaff_R14;
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      unaff_R12 = (gen_ctx *)&DAT_00000001;
      pgVar45 = pgVar50;
      do {
        if ((pgVar45 < pgVar37) &&
           (unaff_R13 = (MIR_context_t)((ulong)pgVar45 >> 6),
           (conflict_locs->varr[(long)unaff_R13] >> ((ulong)pgVar45 & 0x3f) & 1) != 0)) {
          if ((char)unaff_RBP != '\0') goto LAB_00170261;
          break;
        }
        unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),unaff_R12 < unaff_R14);
        pgVar45 = (gen_ctx_t)(ulong)((int)pgVar45 + 1);
        puVar3 = (undefined1 *)((long)&unaff_R15->ctx + 1) + (long)unaff_R12;
        unaff_R12 = (gen_ctx *)((long)&unaff_R12->ctx + 1);
      } while (puVar3 != &DAT_00000001);
      uVar44 = uVar44 & uVar49 - 0x22;
      pgVar45 = (gen_ctx_t)(ulong)uVar44;
      uVar44 = ~uVar42 | uVar44;
      pgVar37 = (gen_ctx_t)(ulong)uVar44;
      if (uVar44 == 0) {
        uVar42 = uVar49;
      }
LAB_00170261:
      pgVar50 = (gen_ctx_t)(ulong)(uVar49 + 1);
    } while (pgVar50 <= pgVar46);
  }
  if (uVar42 == 0xffffffff) {
    uVar44 = 0;
    uVar39 = 1;
    do {
      bVar59 = uVar44 != 0;
      uVar42 = (uint)sVar52 + 0x22;
      uVar44 = ((uint)sVar52 < 0xffffffde && type == MIR_T_LD) + 1;
      if (bVar59) {
        uVar42 = (uint)pgVar37;
        uVar44 = uVar39;
      }
      uVar39 = uVar44;
      uVar44 = 2;
      if (!bVar59) {
        uVar44 = (uint)((uVar42 - 0x22) % uVar39 == 0);
      }
      sVar52 = sVar52 + 1;
      pgVar37 = (gen_ctx_t)(ulong)uVar42;
    } while (uVar44 < uVar39);
    gen_ctx->func_stack_slots_num = sVar52;
  }
  *slots_num_ref = uVar39;
  return uVar42;
LAB_0017032b:
  pgVar43 = (gen_ctx *)(ulong)uVar42;
  plVar6 = *(long **)(extraout_RDX + (long)res * 8);
  if (plVar6 != (long *)0x0) {
    bm = (gen_ctx *)(*plVar6 << 6);
    if (((pgVar48 < bm) &&
        (pgVar53 = (gen_ctx *)plVar6[2],
        ((ulong)pgVar53->call_used_hard_regs[((ulong)pgVar48 >> 6) - 0xd] &
        1L << ((ulong)pgVar48 & 0x3f)) != 0)) ||
       ((1 < (int)pgVar45 &&
        ((0x21 < uVar44 ||
         (((gen_ctx *)(ulong)uVar44 < bm && ((*(ulong *)plVar6[2] & (ulong)pgVar40) != 0))))))))
    goto LAB_00170371;
    bVar59 = (long)pgVar35 <= (long)res;
    uVar42 = uVar42 - 1;
    res = (gen_ctx *)((long)&res->ctx + 1);
    if (uVar42 == 0) {
LAB_00170371:
      return (uint)bVar59;
    }
    goto LAB_0017032b;
  }
  pgStack_78 = (gen_ctx *)gap_lr_spill_cost;
  uStack_70 = (ulong)uVar39;
  pgStack_68 = unaff_R12;
  pgStack_60 = unaff_R14;
  pgStack_58 = unaff_R15;
  pcStack_50 = (code *)unaff_RBP;
  available_hreg_p_cold_1();
  pbVar7 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
  pgStack_88 = (gen_ctx_t)0x0;
  pgVar46 = pgVar45;
  bb = pgVar48;
  pMVar55 = unaff_R13;
  pgStack_c0 = pgStack_88;
  uStack_a8 = extraout_RAX;
  pgStack_a0 = pgVar40;
  pgStack_98 = pgVar53;
  pMStack_90 = unaff_R13;
  pgStack_80 = bm;
  pgStack_78 = pgVar43;
  if ((pbVar7 == (bb_insn_t)0x0) || (*(long *)&pbVar7->mem_index == 0)) goto LAB_0017053a;
  pbVar7->insn = (MIR_insn_t)0x0;
  pgVar53 = (gen_ctx *)pgVar45->ctx;
  if (pgVar53 == (gen_ctx *)0x0) goto LAB_00170401;
  pMVar55 = (MIR_context_t)&DAT_00000001;
  while( true ) {
    bm = (gen_ctx *)((MIR_module *)&pgVar48->temp_bitmap)->data;
    pgVar43 = (gen_ctx *)((gen_ctx *)pgVar53->ctx)->ctx;
    pgVar46 = (gen_ctx_t)((long)&pgVar43->ctx + 1);
    pgStack_b0 = (gen_ctx *)0x1703da;
    bb = bm;
    bitmap_expand((bitmap_t)bm,(size_t)pgVar46);
    if (bm == (gen_ctx *)0x0) break;
    pgVar35 = (gen_ctx *)((ulong)pgVar43 >> 6);
    ppvVar1 = &bm->curr_func_item->data + (long)pgVar35;
    *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)pgVar43 & 0x3f));
    pgVar53 = *(gen_ctx **)&pgVar53->optimize_level;
    if (pgVar53 == (gen_ctx *)0x0) {
LAB_00170401:
      pMVar55 = pgVar45->ctx;
      if (pMVar55 == (MIR_context_t)0x0) {
        uStack_a8 = 0;
      }
      else {
        uStack_a8 = 0;
        do {
          pgVar53 = pMVar55->gen_ctx;
          pgStack_b0 = (gen_ctx *)0x170421;
          bb = pgVar53;
          uVar42 = bb_loop_level((bb_t_conflict)pgVar53);
          bm = (gen_ctx *)(ulong)uVar42;
          pgVar43 = (gen_ctx *)0xffffffff;
          for (pgVar45 = (gen_ctx_t)((DLIST_out_edge_t *)&pgVar53->addr_regs)->head;
              iVar26 = (int)pgVar43, pgVar45 != (gen_ctx_t)0x0;
              pgVar45 = (gen_ctx_t)pgVar45->to_free) {
            pbVar7 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
            if (pbVar7 == (bb_insn_t)0x0) {
              pgStack_b0 = (gen_ctx *)0x170530;
              gap_lr_spill_cost_cold_2();
              goto LAB_00170530;
            }
            bb = (gen_ctx *)((DLIST_LINK_MIR_insn_t *)&pgVar45->optimize_level)->prev;
            pgVar35 = (gen_ctx *)bb->ctx;
            if (((gen_ctx *)((long)pbVar7->insn << 6) <= pgVar35) ||
               ((*(ulong *)(*(long *)&pbVar7->mem_index + ((ulong)pgVar35 >> 6) * 8) >>
                 ((ulong)pgVar35 & 0x3f) & 1) == 0)) {
              pgStack_b0 = (gen_ctx *)0x17046d;
              iVar25 = bb_loop_level((bb_t_conflict)bb);
              pgVar35 = (gen_ctx *)(ulong)(iVar25 + 1U);
              if (iVar26 <= iVar25) {
                pgVar43 = (gen_ctx *)(ulong)(iVar25 + 1U);
              }
            }
          }
          uVar42 = uVar42 + 1;
          bm = (gen_ctx *)(ulong)uVar42;
          if (-1 < iVar26) {
            if ((int)uVar42 <= iVar26) {
              pgVar43 = bm;
            }
            uStack_a8 = (ulong)(uint)((int)uStack_a8 + (int)pgVar43 * 2);
          }
          pgVar43 = (gen_ctx *)0xffffffff;
          for (pgVar45 = (gen_ctx_t)((DLIST_in_edge_t *)&pgVar53->addr_insn_p)->head;
              uVar39 = (uint)pgVar43, pgVar45 != (gen_ctx_t)0x0;
              pgVar45 = (gen_ctx_t)pgVar45->debug_file) {
            pbVar7 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
            if (pbVar7 == (bb_insn_t)0x0) goto LAB_00170530;
            bb = (gen_ctx *)pgVar45->ctx;
            pgVar35 = (gen_ctx *)bb->ctx;
            if (((gen_ctx *)((long)pbVar7->insn << 6) <= pgVar35) ||
               ((*(ulong *)(*(long *)&pbVar7->mem_index + ((ulong)pgVar35 >> 6) * 8) >>
                 ((ulong)pgVar35 & 0x3f) & 1) == 0)) {
              pgStack_b0 = (gen_ctx *)0x1704dc;
              iVar26 = bb_loop_level((bb_t_conflict)bb);
              pgVar35 = (gen_ctx *)(ulong)(iVar26 + 1U);
              if ((int)uVar39 <= iVar26) {
                pgVar43 = (gen_ctx *)(ulong)(iVar26 + 1U);
              }
            }
          }
          if (-1 < (int)uVar39) {
            if ((int)uVar39 < (int)uVar42) {
              uVar42 = uVar39;
            }
            uStack_a8 = (ulong)((int)uStack_a8 + uVar42 * 2);
          }
          pMVar55 = (MIR_context_t)pMVar55->c2mir_ctx;
        } while (pMVar55 != (MIR_context_t)0x0);
      }
      return (MIR_reg_t)uStack_a8;
    }
  }
LAB_00170535:
  pgStack_b0 = (gen_ctx *)0x17053a;
  gap_lr_spill_cost_cold_1();
  pgVar40 = pgVar48;
  pgStack_c0 = pgVar45;
LAB_0017053a:
  pgStack_b0 = (gen_ctx *)HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  peVar58 = (in_edge_t_conflict)bb->tied_regs;
  pgStack_110 = pgVar46;
  pgStack_d8 = pgVar40;
  pgStack_d0 = pgVar53;
  pMStack_c8 = pMVar55;
  pgStack_b8 = bm;
  pgStack_b0 = pgVar43;
  if (peVar58 == (in_edge_t_conflict)0x0) {
    pgStack_128 = (gen_ctx *)0x1708ad;
    HTAB_lr_gap_t_do_cold_8();
    pgVar48 = pgVar35;
    pgVar45 = bb;
    res = bm;
LAB_001708ad:
    pgStack_128 = (gen_ctx *)0x1708b2;
    HTAB_lr_gap_t_do_cold_7();
LAB_001708b2:
    pgStack_128 = (gen_ctx *)0x1708b7;
    HTAB_lr_gap_t_do_cold_2();
LAB_001708b7:
    pgStack_128 = (gen_ctx *)0x1708bc;
    HTAB_lr_gap_t_do_cold_1();
    pgVar35 = pgVar40;
LAB_001708bc:
    pgStack_128 = (gen_ctx *)0x1708c1;
    HTAB_lr_gap_t_do_cold_4();
LAB_001708c1:
    pgStack_128 = (gen_ctx *)0x1708c6;
    HTAB_lr_gap_t_do_cold_6();
  }
  else {
    peVar8 = ((DLIST_in_edge_t *)&bb->addr_insn_p)->head;
    pgVar48 = pgVar35;
    pgVar45 = bb;
    if (peVar8 == (in_edge_t_conflict)0x0) goto LAB_001708ad;
    pgVar53 = (gen_ctx *)((ulong)pgVar35 & 0xffffffff);
    pgVar40 = (gen_ctx *)peVar58->src;
    pgVar48 = (gen_ctx *)bb->curr_func_item;
    uVar42 = (int)pgVar35 - 1;
    pgVar43 = (gen_ctx *)(ulong)uVar42;
    pgStack_120 = bb;
    pgStack_118 = pgVar48;
    peStack_108 = extraout_RDX_00;
    if (1 < uVar42) {
LAB_001706df:
      pgStack_128 = (gen_ctx *)0x1706f5;
      iVar26 = (*(code *)pgStack_120->debug_file)(pgStack_110,peStack_108,pgStack_118);
      uVar39 = iVar26 + (uint)(iVar26 == 0);
      pgVar45 = (gen_ctx_t)(ulong)uVar39;
      pgVar46 = pgStack_120;
      if ((in_edge_t_conflict)pgStack_120->tied_regs == (in_edge_t_conflict)0x0) goto LAB_001708b2;
      pgVar48 = (gen_ctx *)((DLIST_in_edge_t *)&pgStack_120->addr_insn_p)->head;
      uStack_f8 = uVar42;
      pgStack_f0 = res;
      pgStack_e8 = pgVar53;
      if (pgVar48 != (gen_ctx *)0x0) {
        uVar57 = (ulong)((int)pgVar40 - 1);
        peVar30 = (((in_edge_t_conflict)pgStack_120->tied_regs)->in_link).prev;
        peVar9 = ((DLIST_LINK_in_edge_t *)&pgVar48->curr_func_item)->prev;
        pMStack_100 = (MIR_context_t)(uint *)0x0;
        uVar42 = uVar39;
        uStack_f4 = uVar39;
        uStack_e0 = uVar57;
        do {
          uVar42 = uVar42 & (uint)uVar57;
          puVar56 = (uint *)((long)&peVar30->src + (ulong)uVar42 * 4);
          uVar31 = (ulong)*puVar56;
          pMVar55 = (MIR_context_t)puVar56;
          if (uVar31 != 0xfffffffe) {
            if (*puVar56 == 0xffffffff) {
              if (1 < uStack_f8) {
                return 0;
              }
              *(int *)&pgVar46->ctx = *(int *)&pgVar46->ctx + 1;
              if (pMStack_100 != (MIR_context_t)0x0) {
                puVar56 = (uint *)pMStack_100;
              }
              uVar57 = (ulong)(uint)*(size_t *)&pgVar46->optimize_level;
              *(int *)(&peVar9->src + uVar57 * 3) = (int)pgVar45;
              (&peVar9->dst)[uVar57 * 3] = (bb_t)pgStack_110;
              *(in_edge_t *)((long)&peVar9->in_link + uVar57 * 0x18) = peStack_108;
              uVar42 = (uint)*(size_t *)&pgVar46->optimize_level;
              pgVar46->optimize_level = uVar42 + 1;
              *puVar56 = uVar42;
              pgStack_f0->ctx = (MIR_context_t)pgStack_110;
              *(in_edge_t *)&pgStack_f0->optimize_level = peStack_108;
              return 0;
            }
            pMVar55 = pMStack_100;
            if (*(int *)(&peVar9->src + uVar31 * 3) == (int)pgVar45) {
              ppbVar2 = &peVar9->src + uVar31 * 3;
              pgStack_128 = (gen_ctx *)0x170790;
              iVar26 = (*(code *)((DLIST_LINK_bb_t *)&pgStack_120->debug_level)->prev)
                                 (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                  pgStack_110,peStack_108,pgStack_118);
              pgVar45 = (gen_ctx_t)(ulong)uStack_f4;
              pMVar55 = pMStack_100;
              uVar57 = uStack_e0;
              pgVar46 = pgStack_120;
              if (iVar26 != 0) {
                if ((int)pgStack_e8 == 3) {
                  *(int *)&pgStack_120->ctx = *(int *)&pgStack_120->ctx + -1;
                  *puVar56 = 0xfffffffe;
                  if ((bb_t)pgStack_120->to_free != (bb_t)0x0) {
                    pgStack_128 = (gen_ctx *)0x17087b;
                    (*(code *)pgStack_120->to_free)
                              (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pgStack_118)
                    ;
                  }
                  *(undefined4 *)ppbVar2 = 0;
                }
                else {
                  if ((int)pgStack_e8 == 2) {
                    if ((bb_t)pgStack_120->to_free != (bb_t)0x0) {
                      pgStack_128 = (gen_ctx *)0x17083e;
                      (*(code *)pgStack_120->to_free)
                                (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                 pgStack_118);
                    }
                    ppbVar2[1] = (bb_t)pgStack_110;
                    ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev = peStack_108;
                  }
                  peVar30 = ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev;
                  pgStack_f0->ctx = (MIR_context_t)ppbVar2[1];
                  *(in_edge_t *)&pgStack_f0->optimize_level = peVar30;
                }
                return 1;
              }
            }
          }
          uVar39 = uVar39 >> 0xb;
          uVar42 = uVar39 + 1 + uVar42 * 5;
          *(int *)&pgVar46->field_0xc = *(int *)&pgVar46->field_0xc + 1;
          pMStack_100 = pMVar55;
        } while( true );
      }
      goto LAB_001708b7;
    }
    pgVar35 = (gen_ctx *)peVar8->src;
    if ((int)*(size_t *)&bb->optimize_level != (int)pgVar35) goto LAB_001706df;
    pgVar45 = (gen_ctx_t)(peVar58->in_link).prev;
    if (pgVar45 == (gen_ctx_t)0x0) goto LAB_001708c1;
    pMVar55 = (MIR_context_t)(ulong)((uint)pgVar40 * 2);
    if ((MIR_context_t)peVar58->dst != pMVar55) {
      pgVar46 = (gen_ctx_t)((long)pMVar55 * 4);
      pgStack_128 = (gen_ctx *)0x1705d1;
      pMStack_100 = pMVar55;
      peVar30 = (in_edge_t)realloc(pgVar45,(size_t)pgVar46);
      (peVar58->in_link).prev = peVar30;
      pMVar55 = pMStack_100;
    }
    peVar58->dst = (bb_t)pMVar55;
    peVar58->src = (bb_t)pMVar55;
    if ((in_edge_t_conflict)pgStack_120->tied_regs != (in_edge_t_conflict)0x0) {
      if ((int)pMVar55 != 0) {
        pgVar45 = (gen_ctx_t)(((in_edge_t_conflict)pgStack_120->tied_regs)->in_link).prev;
        pgVar46 = (gen_ctx_t)0xff;
        pgStack_128 = (gen_ctx *)0x170612;
        memset(pgVar45,0xff,(ulong)((uint)pgVar40 & 0x7fffffff) << 3);
      }
      peVar58 = ((DLIST_in_edge_t *)&pgStack_120->addr_insn_p)->head;
      if ((peVar58 != (in_edge_t_conflict)0x0) &&
         (pgVar45 = (gen_ctx_t)(peVar58->in_link).prev, pgVar45 != (gen_ctx_t)0x0)) {
        pgVar35 = (gen_ctx *)(ulong)(uint)((int)pgVar35 * 2);
        if ((gen_ctx *)peVar58->dst != pgVar35) {
          pgVar46 = (gen_ctx_t)((long)pgVar35 * 0x18);
          pgStack_128 = (gen_ctx *)0x17064d;
          peVar30 = (in_edge_t)realloc(pgVar45,(size_t)pgVar46);
          (peVar58->in_link).prev = peVar30;
        }
        peVar58->dst = (bb_t)pgVar35;
        peVar58->src = (bb_t)pgVar35;
        peVar8 = ((DLIST_in_edge_t *)&pgStack_120->addr_insn_p)->head;
        if (peVar8 == (in_edge_t_conflict)0x0) goto LAB_001708cb;
        pgVar48 = (gen_ctx *)(peVar8->in_link).prev;
        uVar39 = *(uint *)((long)&pgStack_120->ctx + 4);
        uVar44 = (uint)*(size_t *)&pgStack_120->optimize_level;
        *(undefined4 *)&pgStack_120->ctx = 0;
        pgStack_120->optimize_level = 0;
        *(undefined4 *)((long)&pgStack_120->ctx + 4) = 0;
        if (uVar39 < uVar44) {
          peVar58 = (in_edge_t_conflict)((long)&pgVar48->curr_func_item + (ulong)uVar39 * 0x18);
          lVar41 = (ulong)uVar44 - (ulong)uVar39;
          pgVar46 = pgStack_120;
          do {
            if (*(int *)((long)peVar58 + -0x10) != 0) {
              pgStack_128 = (gen_ctx *)0x1706b0;
              el.lr = *(live_range_t_conflict *)peVar58;
              el._0_8_ = *(undefined8 *)((long)peVar58 + -8);
              HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar46,el,HTAB_INSERT,(lr_gap_t *)res);
              pgVar48 = *(gen_ctx **)peVar58;
              pgStack_128 = (gen_ctx *)0x1706ca;
              (*(code *)((DLIST_LINK_bb_t *)&pgStack_120->debug_level)->prev)
                        ((gen_ctx *)res->ctx,*(c2mir_ctx **)&res->optimize_level,
                         *(undefined8 *)((long)peVar58 + -8),pgVar48,pgStack_118);
              pgVar46 = pgStack_120;
            }
            peVar58 = (in_edge_t_conflict)((long)peVar58 + 0x18);
            lVar41 = lVar41 + -1;
          } while (lVar41 != 0);
        }
        pgVar40 = (gen_ctx *)((ulong)pMVar55 & 0xffffffff);
        goto LAB_001706df;
      }
      goto LAB_001708bc;
    }
  }
  pgStack_128 = (gen_ctx *)0x1708cb;
  HTAB_lr_gap_t_do_cold_5();
LAB_001708cb:
  pgStack_128 = (gen_ctx *)rewrite_insn;
  HTAB_lr_gap_t_do_cold_3();
  ctx = pgVar45->ctx;
  uStack_2f8 = 0;
  pgStack_150 = pgVar35;
  pgStack_148 = pgVar53;
  pMStack_140 = pMVar55;
  peStack_138 = peVar58;
  pgStack_130 = res;
  pgStack_128 = pgVar43;
  MIR_new_int_op(ctx,0);
  MIR_new_int_op(ctx,0);
  sStack_2f0 = MIR_insn_nops(ctx,(MIR_insn_t_conflict)pgVar46);
  pDStack_310 = (DLIST_LINK_bb_t *)&pgVar46->debug_level;
  puStack_2b0 = (uint *)((long)&((DLIST_out_edge_t *)&pgVar46->addr_regs)->head + 4);
  uStack_344 = 0xffffffff;
  uStack_304 = 0xffffffff;
  iVar26 = 0;
  pgStack_318 = pgVar48;
  pMStack_300 = ctx;
LAB_00170986:
  if (sStack_2f0 != 0) {
    sVar52 = 0;
    puVar56 = puStack_2b0;
    do {
      MVar27 = MIR_insn_op_mode(ctx,(MIR_insn_t_conflict)pgVar46,sVar52,&iStack_31c);
      pgVar35 = pgStack_318;
      if (((iVar26 != 0) || ((iStack_31c != 0 && ((char)puVar56[-7] != '\v')))) &&
         ((iStack_31c == 0 || iVar26 != 1 || ((char)puVar56[-7] == '\v')))) {
        if ((char)puVar56[-7] == '\v') {
          uVar57 = (ulong)puVar56[-1];
          if (uVar57 < 0x22) {
            pVVar10 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar10,uVar57 + 1);
            if (pVVar10 == (bitmap_t)0x0) goto LAB_001720bd;
            *pVVar10->varr = *pVVar10->varr | 1L << (uVar57 & 0x3f);
          }
          uVar57 = (ulong)*puVar56;
          if (uVar57 < 0x22) {
            pVVar10 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar10,uVar57 + 1);
            if (pVVar10 == (bitmap_t)0x0) goto LAB_001720c2;
            *pVVar10->varr = *pVVar10->varr | 1L << (uVar57 & 0x3f);
          }
          uVar42 = puVar56[-1];
          uVar57 = (ulong)uVar42;
          if (uVar57 != 0xffffffff) {
            uVar39 = *puVar56;
            if (uVar39 - 0x22 < 0xffffffdd && 0x21 < uVar42) {
              pVVar15 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar15 == (VARR_MIR_reg_t *)0x0) ||
                  (pMVar11 = pVVar15->varr, pMVar11 == (MIR_reg_t *)0x0)) ||
                 (pVVar15->els_num <= uVar57)) goto LAB_001720ae;
              if (0x21 < pMVar11[uVar57]) {
                if (pVVar15->els_num <= (ulong)uVar39) goto LAB_001720db;
                if (0x21 < pMVar11[uVar39]) {
                  if (iStack_31c == 0) {
                    bVar59 = -1 < (int)uStack_344;
                    uVar44 = uStack_304;
                    uVar49 = uStack_304;
                    uStack_344 = (uint)sVar52;
                    if (bVar59) {
                      __assert_fail("in_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5f,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  else {
                    uVar44 = uStack_344;
                    uVar49 = (uint)sVar52;
                    if (-1 < (int)uStack_304) {
                      __assert_fail("out_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5b,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  uStack_304 = uVar49;
                  if ((((int)uVar44 < 0) ||
                      (uVar42 != *(uint *)&pDStack_310[(ulong)uVar44 * 3 + 2].prev)) ||
                     (uVar39 != *(uint *)((long)&pDStack_310[(ulong)uVar44 * 3 + 2].prev + 4))) {
                    uStack_2f8 = (ulong)((int)uStack_2f8 + 2);
                  }
                }
              }
            }
          }
          if (pgStack_318 != (gen_ctx *)0x0) {
            if (uVar42 != 0xffffffff) {
              update_live(uVar42,0,(bitmap_t)*(bb_t *)&pgStack_318->optimize_level);
              uVar57 = (ulong)puVar56[-1];
              if (0x21 < uVar57) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_318->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d6;
                if ((uVar57 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar42 = puVar56[-1] >> 6,
                   pbVar13 = (&peVar30->src)[uVar42],
                   (&peVar30->src)[uVar42] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar57 & 0x3f))),
                   ((ulong)pbVar13 >> (uVar57 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,puVar56[-1],base_reg,(MIR_insn_t)pgVar46,1,0);
                }
              }
            }
            pgVar35 = pgStack_318;
            ctx = pMStack_300;
            if (*puVar56 != 0xffffffff) {
              update_live(*puVar56,0,(bitmap_t)*(bb_t *)&pgStack_318->optimize_level);
              ctx = pMStack_300;
              uVar57 = (ulong)*puVar56;
              if (0x21 < uVar57) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar35->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d1;
                if ((uVar57 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar42 = *puVar56 >> 6,
                   pbVar13 = (&peVar30->src)[uVar42],
                   (&peVar30->src)[uVar42] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar57 & 0x3f))),
                   ((ulong)pbVar13 >> (uVar57 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,*puVar56,base_reg,(MIR_insn_t)pgVar46,1,0);
                }
              }
            }
          }
        }
        else if ((char)puVar56[-7] == '\x02') {
          uVar57 = (ulong)puVar56[-5];
          if (uVar57 < 0x22) {
            pVVar10 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar10,uVar57 + 1);
            if (pVVar10 == (bitmap_t)0x0) goto LAB_001720b8;
            *pVVar10->varr = *pVVar10->varr | 1L << (uVar57 & 0x3f);
            if (pgStack_318 != (gen_ctx *)0x0) {
              update_live(puVar56[-5],iStack_31c,(bitmap_t)*(bb_t *)&pgStack_318->optimize_level);
            }
          }
          else {
            if (iStack_31c == 0) {
              pVVar15 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar15->els_num <= uVar57)) goto LAB_001720b3;
              if (0x21 < pVVar15->varr[uVar57]) {
                uStack_2f8 = (ulong)((int)uStack_2f8 + (uint)(MVar27 - MIR_OP_REF < 0xfffffffd));
              }
            }
            ctx = pMStack_300;
            if (pgStack_318 != (gen_ctx *)0x0) {
              update_live(puVar56[-5],iStack_31c,(bitmap_t)*(bb_t *)&pgStack_318->optimize_level);
              ctx = pMStack_300;
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar35->curr_func_item)->prev;
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720cc;
              uVar57 = (ulong)puVar56[-5];
              if ((uVar57 < (ulong)((long)peVar30->src << 6)) &&
                 (peVar30 = (peVar30->in_link).prev, uVar42 = puVar56[-5] >> 6,
                 pbVar13 = (&peVar30->src)[uVar42],
                 (&peVar30->src)[uVar42] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar57 & 0x3f))),
                 ((ulong)pbVar13 >> (uVar57 & 0x3f) & 1) != 0)) {
                spill_restore_reg(pgVar45,puVar56[-5],base_reg,(MIR_insn_t)pgVar46,1,0);
              }
            }
          }
        }
      }
      sVar52 = sVar52 + 1;
      puVar56 = puVar56 + 0xc;
    } while (sStack_2f0 != sVar52);
  }
  pgVar35 = pgStack_318;
  if (iVar26 != 0 || pgStack_318 == (gen_ctx *)0x0) goto LAB_00171238;
  target_get_early_clobbered_hard_regs
            ((MIR_insn_t)pgVar46,(MIR_reg_t *)&MStack_278,(MIR_reg_t *)&MStack_2a8);
  if ((MIR_reg_t)MStack_278.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_278.data,1,(bitmap_t)*(bb_t *)&pgVar35->optimize_level);
  }
  if ((MIR_reg_t)MStack_2a8.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_2a8.data,1,(bitmap_t)*(bb_t *)&pgVar35->optimize_level);
  }
  if (*(int *)&pgVar46->debug_file - 0xaaU < 0xfffffffd) goto LAB_00171238;
  pVVar10 = pgVar45->call_used_hard_regs[0x12];
  if (pVVar10 != (bitmap_t)0x0) {
    pMVar55 = pgVar46->ctx;
    uVar57 = 0;
    do {
      pgVar35 = pgStack_318;
      uVar36 = uVar57 >> 6;
      uVar31 = pVVar10->els_num;
      bVar59 = true;
      uVar47 = uVar57;
      if (uVar36 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00170f18:
        if ((pVVar10->varr[uVar36] == 0) ||
           (uVar51 = pVVar10->varr[uVar36] >> (uVar57 & 0x3f), uVar51 == 0)) goto LAB_00170f2b;
        uVar31 = uVar51 & 1;
        uStack_328 = uVar57;
        while (uVar31 == 0) {
          uStack_328 = uStack_328 + 1;
          uVar31 = uVar51 & 2;
          uVar51 = uVar51 >> 1;
        }
        uVar47 = uStack_328 + 1;
        bVar59 = false;
      }
LAB_00170f64:
      if (bVar59) goto LAB_00170f94;
      update_live((MIR_reg_t)uStack_328,1,(bitmap_t)*(bb_t *)&pgStack_318->optimize_level);
      uVar57 = uVar47;
      if (pVVar10 == (bitmap_t)0x0) break;
    } while( true );
  }
  rewrite_insn_cold_16();
  goto LAB_0017209a;
LAB_00170530:
  pgStack_b0 = (gen_ctx *)0x170535;
  gap_lr_spill_cost_cold_3();
  goto LAB_00170535;
LAB_00170f2b:
  uVar36 = uVar36 + 1;
  uVar57 = uVar36 * 0x40;
  if (uVar31 == uVar36) goto LAB_00170f64;
  goto LAB_00170f18;
LAB_00170f94:
  pHVar12 = pMVar55->module_item_tab;
  if (pHVar12 != (HTAB_MIR_item_t *)0x0) {
    uVar57 = 0;
    do {
      uVar36 = uVar57 >> 6;
      uVar31._0_4_ = pHVar12->els_num;
      uVar31._4_4_ = pHVar12->els_start;
      bVar59 = true;
      uVar47 = uVar57;
      if (uVar36 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00170fc9:
        uVar51 = *(ulong *)((long)pHVar12->arg + uVar36 * 8);
        if ((uVar51 == 0) || (uVar51 = uVar51 >> (uVar57 & 0x3f), uVar51 == 0)) goto LAB_00170fdc;
        uVar31 = uVar51 & 1;
        uStack_328 = uVar57;
        while (uVar31 == 0) {
          uStack_328 = uStack_328 + 1;
          uVar31 = uVar51 & 2;
          uVar51 = uVar51 >> 1;
        }
        uVar47 = uStack_328 + 1;
        bVar59 = false;
      }
LAB_00171015:
      if (bVar59) goto LAB_0017103a;
      update_live((MIR_reg_t)uStack_328,0,(bitmap_t)*(bb_t *)&pgVar35->optimize_level);
      uVar57 = uVar47;
      if (pHVar12 == (HTAB_MIR_item_t *)0x0) break;
    } while( true );
  }
LAB_0017209a:
  rewrite_insn_cold_15();
LAB_0017209f:
  rewrite_insn_cold_14();
LAB_001720a4:
  rewrite_insn_cold_12();
LAB_001720a9:
  rewrite_insn_cold_13();
LAB_001720ae:
  rewrite_insn_cold_2();
LAB_001720b3:
  rewrite_insn_cold_8();
LAB_001720b8:
  rewrite_insn_cold_9();
LAB_001720bd:
  rewrite_insn_cold_6();
LAB_001720c2:
  rewrite_insn_cold_5();
LAB_001720c7:
  rewrite_insn_cold_11();
LAB_001720cc:
  rewrite_insn_cold_7();
LAB_001720d1:
  rewrite_insn_cold_4();
LAB_001720d6:
  rewrite_insn_cold_3();
LAB_001720db:
  rewrite_insn_cold_1();
LAB_001720e0:
  rewrite_insn_cold_10();
  goto LAB_001720e5;
LAB_00170fdc:
  uVar36 = uVar36 + 1;
  uVar57 = uVar36 * 0x40;
  if (uVar31 == uVar36) goto LAB_00171015;
  goto LAB_00170fc9;
LAB_0017103a:
  pbVar13 = *(bb_t *)&pgVar35->optimize_level;
  if (pbVar13 != (bb_t)0x0) {
    uVar57 = 0;
    do {
      uVar36 = uVar57 >> 6;
      uVar31 = pbVar13->index;
      bVar59 = true;
      uVar47 = uVar57;
      if (uVar36 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00171068:
        uVar51 = *(ulong *)(pbVar13->rpost + uVar36 * 8);
        if ((uVar51 == 0) || (uVar51 = uVar51 >> (uVar57 & 0x3f), uVar51 == 0)) goto LAB_0017107b;
        uVar31 = uVar51 & 1;
        uStack_328 = uVar57;
        while (uVar31 == 0) {
          uStack_328 = uStack_328 + 1;
          uVar31 = uVar51 & 2;
          uVar51 = uVar51 >> 1;
        }
        uVar47 = uStack_328 + 1;
        bVar59 = false;
      }
LAB_001710b4:
      if (bVar59) goto LAB_00171238;
      if (0x21 < uStack_328) {
        pMVar14 = (pgStack_318->ctx->environment_module).module_link.next;
        if (pMVar14 == (MIR_module_t)0x0) goto LAB_001720a9;
        uVar57 = uStack_328 & 0xffffffff;
        if (((ulong)((long)pMVar14->data << 6) <= uVar57) ||
           (((ulong)(&((pMVar14->items).head)->data)[(uint)uStack_328 >> 6] >> (uStack_328 & 0x3f) &
            1) == 0)) {
          pVVar15 = pgVar45->ra_ctx->reg_renumber;
          if ((pVVar15 == (VARR_MIR_reg_t *)0x0) ||
             ((pVVar15->varr == (MIR_reg_t *)0x0 || (pVVar15->els_num <= uVar57))))
          goto LAB_001720a4;
          uVar31 = (ulong)pVVar15->varr[uVar57];
          if (uVar31 < 0x22) {
            MIR_reg_type(pgVar45->ctx,(uint)uStack_328 - 0x21,(pgVar45->curr_func_item->u).func);
            ctx = pMStack_300;
            pVVar10 = pgVar45->call_used_hard_regs[0x12];
            if (pVVar10 == (bitmap_t)0x0) goto LAB_001720c7;
            if ((uVar31 < pVVar10->els_num << 6) && ((*pVVar10->varr >> (uVar31 & 0x3f) & 1) != 0))
            {
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_318->curr_func_item)->prev;
              bitmap_expand((bitmap_t)peVar30,uVar57 + 1);
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720e0;
              peVar30 = (peVar30->in_link).prev;
              pbVar16 = (&peVar30->src)[(uint)uStack_328 >> 6];
              (&peVar30->src)[(uint)uStack_328 >> 6] =
                   (bb_t)((ulong)pbVar16 | 1L << (uStack_328 & 0x3f));
              if (((ulong)pbVar16 >> (uStack_328 & 0x3f) & 1) == 0) {
                spill_restore_reg(pgVar45,(uint)uStack_328,base_reg,(MIR_insn_t)pgVar46,1,1);
              }
            }
          }
        }
      }
      uVar57 = uVar47;
      if (pbVar13 == (bb_t)0x0) break;
    } while( true );
  }
  goto LAB_0017209f;
LAB_0017107b:
  uVar36 = uVar36 + 1;
  uVar57 = uVar36 * 0x40;
  if (uVar31 == uVar36) goto LAB_001710b4;
  goto LAB_00171068;
LAB_00171238:
  bVar59 = iVar26 != 0;
  iVar26 = iVar26 + 1;
  if (bVar59) goto code_r0x00171245;
  goto LAB_00170986;
code_r0x00171245:
  prVar17 = pgVar45->ra_ctx;
  prVar17->in_reloads_num = 0;
  prVar17->out_reloads_num = 0;
  if ((int)uStack_2f8 < 3) {
LAB_0017165a:
    bVar59 = *(int *)&pgVar46->debug_file - 0x22U < 0xfffffffc;
    if (!bVar59) {
      if (bVar59) {
        __assert_fail("MIR_addr_code_p (insn->code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f03,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      if (*(char *)&pgVar46->temp_bitmap2 != '\x02') {
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar42 = *(uint *)&pgVar46->temp_bitmap3;
      if (0xffffffdc < uVar42 - 0x22) {
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar15 = pgVar45->ra_ctx->reg_renumber;
      if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
         (pVVar15->els_num <= (ulong)uVar42)) goto LAB_00172195;
      pMVar55 = pgVar45->ctx;
      uVar39 = pVVar15->varr[uVar42];
      MVar28 = MIR_reg_type(pMVar55,uVar42 - 0x21,(pgVar45->curr_func_item->u).func);
      if (uVar39 < 0x22) {
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar39 = uVar39 - 0x22;
      if (pgVar45->target_ctx->keep_fp_p == '\0') {
        lVar41 = (ulong)uVar39 << 3;
      }
      else {
        lVar41 = -0xb0;
        if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
          lVar41 = 0;
        }
        lVar41 = lVar41 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar39) * -8;
      }
      MVar29 = get_reload_hreg(pgVar45,0xffffffff,6,0);
      _MIR_new_var_op(pMVar55,MVar29);
      iVar33 = _MIR_addr_offset(pMVar55,*(MIR_insn_code_t *)&pgVar46->debug_file);
      MIR_new_int_op(pMVar55,lVar41 + iVar33);
      pMVar32 = MIR_new_insn(pMVar55,MIR_MOV);
      _MIR_new_var_op(pMVar55,MVar29);
      _MIR_new_var_op(pMVar55,MVar29);
      _MIR_new_var_op(pMVar55,base_reg);
      insn = MIR_new_insn(pMVar55,MIR_ADD);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        if (pgVar45->optimize_level == 0) {
          uVar42 = *(int *)&pgVar46->debug_file - 0xa7;
          pgVar37 = pgVar46;
          if ((uVar42 < 0xe) && ((0x2007U >> (uVar42 & 0x1f) & 1) != 0)) {
            pgVar37 = (gen_ctx_t)pgVar46->ctx;
          }
        }
        else {
          pgVar37 = (gen_ctx_t)&pgVar46->ctx->temp_string;
        }
        fprintf((FILE *)pgVar45->debug_file,"    Adding before insn (in BB %lu) ",
                pgVar37->ctx->gen_ctx);
        MIR_output_insn(pMVar55,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(":\n      ",8,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar55,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar55,pgVar45->debug_file,insn,(pgVar45->curr_func_item->u).func,1);
      }
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,insn);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Changing ",9,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar55,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar46->debug_file = 0;
      _MIR_new_var_op(pMVar55,MVar29);
      auVar4._16_16_ = auStack_1a8;
      auVar4._0_16_ = auStack_1b8;
      pgVar46->temp_bitmap3 = (bitmap_t)auStack_1a8._0_8_;
      pgVar46->call_used_hard_regs[0] = (bitmap_t)auStack_1a8._8_8_;
      pgVar46->call_used_hard_regs[1] = (bitmap_t)auStack_198._0_8_;
      pgVar46->call_used_hard_regs[2] = (bitmap_t)auStack_198._8_8_;
      *(undefined1 (*) [32])&pgVar46->temp_bitmap = auVar4;
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite(" to ",4,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar55,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,1);
      }
    }
    if (sStack_2f0 != 0) {
      uVar42 = *(int *)&pgVar46->debug_file - 0xaa;
      sVar52 = 0;
      pgStack_318 = (gen_ctx *)CONCAT44(pgStack_318._4_4_,uVar42);
      do {
        pDVar54 = pDStack_310 + sVar52 * 3;
        MVar27 = MIR_insn_op_mode(pMStack_300,(MIR_insn_t_conflict)pgVar46,sVar52,&iStack_31c);
        if ((pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          pauVar34 = (undefined1 (*) [32])&pbStack_248;
          if (iStack_31c == 0) {
            pauVar34 = (undefined1 (*) [32])&pbStack_218;
          }
          auVar4 = *(undefined1 (*) [32])pDVar54;
          *(undefined1 (*) [32])(*pauVar34 + 0x10) = *(undefined1 (*) [32])(pDVar54 + 1);
          *pauVar34 = auVar4;
        }
        if (*(char *)&pDVar54->next == '\v') {
          if ((uVar42 < 0xfffffffd) ||
             (*(byte *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head - 0x11 < 0xfffffffb)) {
            if (0x22 < *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar54 + 2))->head + 1) {
              MVar29 = change_reg(pgVar45,&MStack_2e8,
                                  *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar54 + 2))->head,base_reg,
                                  MIR_OP_INT,(MIR_insn_t)pgVar46,0);
              *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar54 + 2))->head = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar29 = *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar54 + 2))->head + 4);
            if (0x22 < MVar29 + 1) {
              MVar29 = change_reg(pgVar45,&MStack_2e8,MVar29,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar46
                                  ,0);
              *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar54 + 2))->head + 4) = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((*(char *)&pDVar54->next == '\x02') &&
                (0x21 < *(uint *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head)) {
          if (MVar27 == MIR_OP_VAR) {
            if ((*(int *)&pgVar46->debug_file != 0xb9) &&
               ((sVar52 != 1 || (3 < *(int *)&pgVar46->debug_file - 0x1eU)))) goto LAB_0017219a;
            MVar28 = MIR_reg_type(pMStack_300,
                                  *(uint *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head - 0x21,
                                  (pgVar45->curr_func_item->u).func);
            if (MVar28 == MIR_T_F) {
              MVar27 = MIR_OP_FLOAT;
            }
            else if (MVar28 == MIR_T_D) {
              MVar27 = MIR_OP_DOUBLE;
            }
            else {
              MVar27 = (uint)(MVar28 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar15 = pgVar45->ra_ctx->reg_renumber;
          if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
             (pVVar15->els_num <= (ulong)*(uint *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head)) {
LAB_001720e5:
            rewrite_insn_cold_18();
LAB_001720ed:
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar52 == 0) && (*(int *)&pgVar46->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar39 = pVVar15->varr[*(uint *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head],
             0x21 < uVar39)) {
            pMVar55 = pgVar45->ctx;
            MVar28 = MIR_reg_type(pMVar55,*(int *)&((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head
                                          - 0x21,(pgVar45->curr_func_item->u).func);
            uVar39 = uVar39 - 0x22;
            if (pgVar45->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar39 << 3;
            }
            else {
              lVar41 = -0xb0;
              if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
                lVar41 = 0;
              }
              disp = lVar41 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar39) * -8;
            }
            iVar26 = *(int *)&((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head;
            auVar4 = *(undefined1 (*) [32])pDStack_310;
            MStack_278.u._16_8_ = SUB328(*(undefined1 (*) [32])(pDStack_310 + 1),0x10);
            MStack_278.u.mem.disp = SUB328(*(undefined1 (*) [32])(pDStack_310 + 1),0x18);
            MStack_278.data._0_4_ = auVar4._0_4_;
            MStack_278.data._4_4_ = auVar4._4_4_;
            MStack_278._8_8_ = auVar4._8_8_;
            MStack_278.u.i = auVar4._16_8_;
            MStack_278.u.str.s = auVar4._24_8_;
            _MIR_new_var_mem_op(&MStack_2a8,pMVar55,MVar28,disp,base_reg,0xffffffff,'\0');
            pFVar18 = pgVar46->debug_file;
            if ((int)((ulong)pFVar18 >> 0x20) < 1) {
              uVar42 = 0;
            }
            else {
              uVar57 = 0;
              uVar42 = 0;
              pDVar38 = (DLIST_in_edge_t *)&pgVar46->addr_insn_p;
              do {
                if ((*(char *)&((DLIST_LINK_bb_t *)(pDVar38 + -1))->next == '\x02') &&
                   (*(int *)&pDVar38->head == iVar26)) {
                  auVar21._4_4_ = MStack_2a8.data._4_4_;
                  auVar21._0_4_ = (MIR_reg_t)MStack_2a8.data;
                  auVar21._8_8_ = MStack_2a8._8_8_;
                  auVar21._16_8_ = MStack_2a8.u.i;
                  auVar21._24_8_ = MStack_2a8.u.str.s;
                  auVar22._8_8_ = MStack_2a8.u.str.s;
                  auVar22._0_8_ = MStack_2a8.u.i;
                  auVar22._16_8_ = MStack_2a8.u._16_8_;
                  auVar22._24_8_ = MStack_2a8.u.mem.disp;
                  *(undefined1 (*) [32])pDVar38 = auVar22;
                  *(undefined1 (*) [32])(pDVar38 + -1) = auVar21;
                  if (1 < (int)uVar42) goto LAB_001720ed;
                  lVar41 = (long)(int)uVar42;
                  uVar42 = uVar42 + 1;
                  aiStack_1e8[lVar41] = (int)uVar57;
                }
                uVar57 = uVar57 + 1;
                pDVar38 = pDVar38 + 3;
              } while ((ulong)pFVar18 >> 0x20 != uVar57);
            }
            iVar26 = find_insn_pattern(pgVar45,(MIR_insn_t)pgVar46,(int *)0x0);
            if (0 < (int)uVar42 && iVar26 < 0) {
              uVar57 = 0;
              do {
                iVar25 = aiStack_1e8[uVar57];
                auVar23._4_4_ = MStack_278.data._4_4_;
                auVar23._0_4_ = (MIR_reg_t)MStack_278.data;
                auVar23._8_8_ = MStack_278._8_8_;
                auVar23._16_8_ = MStack_278.u.i;
                auVar23._24_8_ = MStack_278.u.str.s;
                auVar24._8_8_ = MStack_278.u.str.s;
                auVar24._0_8_ = MStack_278.u.i;
                auVar24._16_8_ = MStack_278.u._16_8_;
                auVar24._24_8_ = MStack_278.u.mem.disp;
                *(undefined1 (*) [32])(pDStack_310 + (long)iVar25 * 3 + 1) = auVar24;
                *(undefined1 (*) [32])(pDStack_310 + (long)iVar25 * 3) = auVar23;
                uVar57 = uVar57 + 1;
              } while (uVar42 != uVar57);
            }
            uVar42 = (uint)pgStack_318;
            if (-1 < iVar26) goto LAB_00171ebc;
          }
          MVar29 = change_reg(pgVar45,&MStack_2e8,
                              *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head,base_reg,
                              MVar27,(MIR_insn_t)pgVar46,iStack_31c);
          if (MVar29 == 0xffffffff) {
            auVar19._8_8_ = MStack_2e8._8_8_;
            auVar19._0_8_ = MStack_2e8.data;
            auVar19._16_8_ = MStack_2e8.u.i;
            auVar19._24_8_ = MStack_2e8.u.str.s;
            auVar20._8_8_ = MStack_2e8.u.str.s;
            auVar20._0_8_ = MStack_2e8.u.i;
            auVar20._16_8_ = MStack_2e8.u._16_8_;
            auVar20._24_8_ = MStack_2e8.u.mem.disp;
            *(undefined1 (*) [32])(pDVar54 + 1) = auVar20;
            *(undefined1 (*) [32])pDVar54 = auVar19;
          }
          else {
            *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar54 + 1))->head = MVar29;
          }
        }
LAB_00171ebc:
        sVar52 = sVar52 + 1;
      } while (sVar52 != sStack_2f0);
    }
    pDVar54 = pDStack_310;
    MVar29 = 0;
    if ((((ulong)pgVar46->debug_file & 0xfffffffc) == 0) &&
       (op1_00._12_4_ = (int)((ulong)pgVar46->to_free >> 0x20),
       op1_00._0_12_ = *(undefined1 (*) [12])&pgVar46->debug_level,
       op1_00.u.i = (int64_t)((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head,
       op1_00.u.mem.nonalias = (int)(in_edge_t_conflict)pgVar46->tied_regs,
       op1_00.u.mem.nloc = (int)((ulong)pgVar46->tied_regs >> 0x20),
       op1_00.u._16_8_ = ((DLIST_out_edge_t *)&pgVar46->addr_regs)->head,
       op1_00.u.mem.disp = (MIR_disp_t)pgVar46->insn_to_consider,
       iVar26 = MIR_op_eq_p(pMStack_300,op1_00,*(MIR_op_t *)&pgVar46->temp_bitmap), MVar29 = 0,
       iVar26 != 0)) {
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar45->debug_file);
        pMVar55 = pMStack_300;
        MIR_output_insn(pMStack_300,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(" which was ",0xb,1,(FILE *)pgVar45->debug_file);
        ((DLIST_in_edge_t *)(pDVar54 + 1))->head = peStack_238;
        ((DLIST_in_edge_t *)(pDVar54 + 1))->tail = peStack_230;
        ((DLIST_out_edge_t *)(pDVar54 + 2))->head = peStack_228;
        ((DLIST_out_edge_t *)(pDVar54 + 2))->tail = peStack_220;
        pDVar54->prev = pbStack_248;
        pDVar54->next = pbStack_240;
        ((DLIST_in_edge_t *)(pDVar54 + 1))->head = peStack_238;
        ((DLIST_in_edge_t *)(pDVar54 + 1))->tail = peStack_230;
        pgVar46->temp_bitmap3 = pVStack_208;
        pgVar46->call_used_hard_regs[0] = pVStack_200;
        pgVar46->call_used_hard_regs[1] = pVStack_1f8;
        pgVar46->call_used_hard_regs[2] = pVStack_1f0;
        ((DLIST_bb_insn_t *)&pgVar46->temp_bitmap)->head = pbStack_218;
        pgVar46->temp_bitmap2 = (bitmap_t)pbStack_210;
        pgVar46->temp_bitmap3 = pVStack_208;
        pgVar46->call_used_hard_regs[0] = pVStack_200;
        MIR_output_insn(pMVar55,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,1);
      }
      if ((((pgVar45->optimize_level != 0) &&
           (pMVar55 = pgVar46->ctx, pMVar55 != (MIR_context_t)0x0)) &&
          ((MIR_context_t)pMVar55->temp_string[3].size == pMVar55)) &&
         ((MIR_context_t)pMVar55->temp_string[3].varr == pMVar55)) {
        pMVar32 = MIR_new_insn_arr(pgVar45->ctx,MIR_USE,0,(MIR_op_t *)0x0);
        MIR_insert_insn_before
                  (pgVar45->ctx,pgVar45->curr_func_item,(MIR_insn_t_conflict)pMVar55->gen_ctx,
                   pMVar32);
        add_new_bb_insn(pgVar45,pMVar32,(bb_t_conflict)pMVar55->temp_string,0);
      }
      gen_delete_insn(pgVar45,(MIR_insn_t)pgVar46);
      MVar29 = 1;
    }
    return MVar29;
  }
  if ((int)(uStack_344 & uStack_304) < 0) {
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar55 = pgVar45->ctx;
  uVar42 = uStack_344;
  if (-1 < (int)uStack_304) {
    uVar42 = uStack_304;
  }
  lVar41 = (long)(int)uVar42;
  uVar42 = *(uint *)&pDStack_310[lVar41 * 3 + 2].prev;
  uVar47 = (ulong)*(uint *)((long)&pDStack_310[lVar41 * 3 + 2].prev + 4);
  uVar57 = (ulong)uStack_344;
  uVar31 = (ulong)uStack_304;
  if (-1 < (int)(uStack_344 | uStack_304)) {
    pDVar54 = pDStack_310 + uVar57 * 3;
    op1._12_4_ = (int)((ulong)pDVar54->next >> 0x20);
    op1._0_12_ = *(undefined1 (*) [12])pDVar54;
    op1.u.i = (int64_t)((DLIST_in_edge_t *)(pDVar54 + 1))->head;
    op1.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDVar54 + 1))->tail;
    op1.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDVar54 + 1))->tail >> 0x20);
    op1.u._16_8_ = pDStack_310[uVar57 * 3 + 2].prev;
    op1.u.mem.disp = (MIR_disp_t)pDStack_310[uVar57 * 3 + 2].next;
    op2.u._16_8_ = pDStack_310[uVar31 * 3 + 2].prev;
    op2._0_32_ = *(undefined1 (*) [32])(pDStack_310 + uVar31 * 3);
    op2.u.mem.disp = (MIR_disp_t)pDStack_310[uVar31 * 3 + 2].next;
    iVar26 = MIR_op_eq_p(pMVar55,op1,op2);
    if (iVar26 == 0) {
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
  }
  pVVar15 = pgVar45->ra_ctx->reg_renumber;
  if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
     (pVVar15->els_num <= (ulong)uVar42)) {
    rewrite_insn_cold_20();
  }
  else {
    add_ld_st(pgVar45,&MStack_278,pVVar15->varr[uVar42],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar46,0);
    pDVar54 = pDStack_310;
    pVVar15 = pgVar45->ra_ctx->reg_renumber;
    if (((pVVar15 != (VARR_MIR_reg_t *)0x0) && (pVVar15->varr != (MIR_reg_t *)0x0)) &&
       (uVar47 < pVVar15->els_num)) {
      add_ld_st(pgVar45,&MStack_278,pVVar15->varr[uVar47],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar46,0);
      _MIR_new_var_op(pMVar55,10);
      _MIR_new_var_op(pMVar55,0xb);
      bVar5 = *(byte *)((long)&pDVar54[lVar41 * 3 + 1].prev + 1);
      uVar47 = (ulong)bVar5;
      if (bVar5 == 0) {
        iVar33 = -1;
LAB_00171476:
        MIR_new_int_op(pMVar55,iVar33);
        pMVar32 = MIR_new_insn(pMVar55,MIR_LSH);
        gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
        if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
          MIR_output_insn(pMVar55,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
        }
      }
      else if (bVar5 != 1) {
        lVar41 = 0;
        uVar36 = uVar47;
        if ((bVar5 & 1) == 0) {
          do {
            lVar41 = lVar41 + 1;
            uVar47 = uVar36 >> 1;
            uVar51 = uVar36 & 2;
            uVar36 = uVar47;
          } while (uVar51 == 0);
        }
        iVar33 = -1;
        if (uVar47 == 1) {
          iVar33 = lVar41;
        }
        goto LAB_00171476;
      }
      pMVar32 = MIR_new_insn(pMVar55,MIR_ADD);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar55,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_304) {
        pDStack_310[uVar31 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      if (-1 < (int)uStack_344) {
        pDStack_310[uVar57 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      get_reload_hreg(pgVar45,0xffffffff,6,0);
      goto LAB_0017165a;
    }
  }
  rewrite_insn_cold_19();
LAB_00172195:
  rewrite_insn_cold_17();
LAB_0017219a:
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static MIR_reg_t get_stack_loc (gen_ctx_t gen_ctx, MIR_reg_t start_loc, MIR_type_t type,
                                bitmap_t conflict_locs, int *slots_num_ref) {
  MIR_reg_t loc, curr_loc, best_loc = MIR_NON_VAR;
  int k, slots_num = 1;
  for (loc = start_loc; loc <= func_stack_slots_num + MAX_HARD_REG; loc++) {
    slots_num = target_locs_num (loc, type);
    if (target_nth_loc (loc, type, slots_num - 1) > func_stack_slots_num + MAX_HARD_REG) break;
    for (k = 0; k < slots_num; k++) {
      curr_loc = target_nth_loc (loc, type, k);
      if (bitmap_bit_p (conflict_locs, curr_loc)) break;
    }
    if (k < slots_num) continue;
    if ((loc - MAX_HARD_REG - 1) % slots_num != 0)
      continue; /* we align stack slots according to the type size */
    if (best_loc == MIR_NON_VAR) best_loc = loc;
  }
  if (best_loc == MIR_NON_VAR) best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
  *slots_num_ref = slots_num;
  return best_loc;
}